

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::ScanLineInputFile::rawPixelData
          (ScanLineInputFile *this,int firstScanLine,char **pixelData,int *pixelDataSize)

{
  exr_result_t eVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined4 *in_RCX;
  undefined8 *in_RDX;
  lock_guard<std::mutex> lock;
  stringstream _iex_throw_s;
  uint64_t maxsize;
  int *in_stack_00000508;
  char *in_stack_00000510;
  int in_stack_0000051c;
  ScanLineInputFile *in_stack_00000520;
  stringstream *in_stack_fffffffffffffde8;
  ArgExc *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined8 in_stack_fffffffffffffe00;
  int part_index;
  exr_const_context_t in_stack_fffffffffffffe08;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  undefined8 local_28;
  undefined4 *local_20;
  undefined8 *local_18;
  
  part_index = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  local_28 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x1aa9d4);
  std::
  __shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1aa9e7);
  eVar1 = exr_get_chunk_unpacked_size
                    (in_stack_fffffffffffffe08,part_index,
                     (uint64_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<(local_1a0,"Unable to query data size of chunk in file \'");
    pcVar3 = fileName((ScanLineInputFile *)0x1aaa3b);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\'");
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  std::
  __shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1aaaf3);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffdf0,
             (mutex_type *)in_stack_fffffffffffffde8);
  std::
  __shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1aab11);
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
  std::
  __shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1aab3a);
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1aab46);
  *local_18 = pcVar3;
  *local_20 = (undefined4)local_28;
  std::
  __shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1aab7a);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x1aab86);
  rawPixelDataToBuffer(in_stack_00000520,in_stack_0000051c,in_stack_00000510,in_stack_00000508);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1aabab);
  return;
}

Assistant:

void
ScanLineInputFile::rawPixelData (
    int firstScanLine, const char*& pixelData, int& pixelDataSize)
{
    uint64_t maxsize = 0;
    if (EXR_ERR_SUCCESS !=
        exr_get_chunk_unpacked_size (_ctxt, _data->partNumber, &maxsize))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to query data size of chunk in file '" << fileName ()
                                                           << "'");
    }

    // again, doesn't actually provide any safety given we're handing
    // back a pointer... but will at least prevent two threads
    // allocating at the same time and getting sliced
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    _data->_pixel_data_scratch.resize (maxsize);

    pixelData     = _data->_pixel_data_scratch.data ();
    pixelDataSize = static_cast<int> (maxsize);

    rawPixelDataToBuffer (
        firstScanLine, _data->_pixel_data_scratch.data (), pixelDataSize);
}